

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

string * __thiscall
cmGlobalGenerator::ExpandCFGIntDir
          (string *__return_storage_ptr__,cmGlobalGenerator *this,string *str,string *param_2)

{
  string *param_2_local;
  string *str_local;
  cmGlobalGenerator *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalGenerator::ExpandCFGIntDir(
  const std::string& str, const std::string& /*config*/) const
{
  return str;
}